

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int jx9Builtin_round(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  jx9_value *pjVar1;
  sxu32 nLen;
  uint uVar2;
  char **zRest;
  uint uVar3;
  double r;
  char zBuf [256];
  double local_140;
  undefined1 local_138 [16];
  char local_128 [264];
  
  if (nArg < 1) {
    pjVar1 = pCtx->pRet;
    jx9MemObjRelease(pjVar1);
    (pjVar1->x).rVal = 0.0;
    pjVar1->iFlags = pjVar1->iFlags & 0xfffffe90U | 2;
  }
  else {
    uVar3 = 0;
    if (nArg != 1) {
      pjVar1 = apArg[1];
      jx9MemObjToInteger(pjVar1);
      uVar3 = *(uint *)&pjVar1->x;
      uVar2 = 0x1e;
      if ((int)uVar3 < 0x1e) {
        uVar2 = uVar3;
      }
      uVar3 = 0;
      if (0 < (int)uVar2) {
        uVar3 = uVar2;
      }
    }
    pjVar1 = *apArg;
    jx9MemObjToReal(pjVar1);
    local_140 = (pjVar1->x).rVal;
    if (((uVar3 != 0) || (local_140 < 0.0)) || (9.223372036854776e+18 <= local_140)) {
      if (((uVar3 != 0) || (0.0 <= local_140)) || (local_140 <= -9.223372036854776e+18)) {
        zRest = (char **)(ulong)uVar3;
        nLen = SyBufferFormat(local_128,0x100,"%.*f");
        SyStrToReal(local_128,nLen,&local_140,zRest);
        local_138._8_8_ = 0;
        local_138._0_8_ = local_140;
      }
      else {
        local_140 = (double)((ulong)(double)(long)(0.5 - local_140) ^ (ulong)DAT_00142930);
        local_138._8_4_ = DAT_00142930._8_4_;
        local_138._0_8_ = local_140;
        local_138._12_4_ = DAT_00142930._12_4_;
      }
    }
    else {
      local_140 = (double)(long)(local_140 + 0.5);
      local_138._8_8_ = 0;
      local_138._0_8_ = local_140;
    }
    pjVar1 = pCtx->pRet;
    jx9MemObjRelease(pjVar1);
    (pjVar1->x).iVal = local_138._0_8_;
    pjVar1->iFlags = pjVar1->iFlags & 0xfffffe90U | 4;
    jx9MemObjTryInteger(pjVar1);
  }
  return 0;
}

Assistant:

static int jx9Builtin_round(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	int n = 0;
	double r;
	if( nArg < 1 ){
		/* Missing argument, return 0 */
		jx9_result_int(pCtx, 0);
		return JX9_OK;
	}
	/* Extract the precision if available */
	if( nArg > 1 ){
		n = jx9_value_to_int(apArg[1]);
		if( n>30 ){
			n = 30;
		}
		if( n<0 ){
			n = 0;
		}
	}
	r = jx9_value_to_double(apArg[0]);
	/* If Y==0 and X will fit in a 64-bit int, 
     * handle the rounding directly.Otherwise 
	 * use our own cutsom printf [i.e:SyBufferFormat()].
     */
  if( n==0 && r>=0 && r<LARGEST_INT64-1 ){
    r = (double)((jx9_int64)(r+0.5));
  }else if( n==0 && r<0 && (-r)<LARGEST_INT64-1 ){
    r = -(double)((jx9_int64)((-r)+0.5));
  }else{
	  char zBuf[256];
	  sxu32 nLen;
	  nLen = SyBufferFormat(zBuf, sizeof(zBuf), "%.*f", n, r);
	  /* Convert the string to real number */
	  SyStrToReal(zBuf, nLen, (void *)&r, 0);
  }
  /* Return thr rounded value */
  jx9_result_double(pCtx, r);
  return JX9_OK;
}